

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O1

void __thiscall gui::Slider::setLabel(Slider *this,shared_ptr<gui::Label> *label)

{
  (this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (label->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(label->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
  if ((label->super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    Signal<gui::Widget_*,_float>::emit(&this->onValueChange,&this->super_Widget,this->value_);
  }
  Widget::requestRedraw(&this->super_Widget);
  return;
}

Assistant:

void Slider::setLabel(std::shared_ptr<Label> label) {
    label_ = label;
    if (label != nullptr) {
        onValueChange.emit(this, value_);
    }
    requestRedraw();
}